

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstack.h
# Opt level: O3

void __thiscall
TPZStack<MaterialDataV,_10>::Push(TPZStack<MaterialDataV,_10> *this,MaterialDataV *object)

{
  MaterialDataV *pMVar1;
  long lVar2;
  
  (*(this->super_TPZManVector<MaterialDataV,_10>).super_TPZVec<MaterialDataV>._vptr_TPZVec[3])
            (this,(this->super_TPZManVector<MaterialDataV,_10>).super_TPZVec<MaterialDataV>.
                  fNElements + 1);
  pMVar1 = (this->super_TPZManVector<MaterialDataV,_10>).super_TPZVec<MaterialDataV>.fStore;
  lVar2 = (this->super_TPZManVector<MaterialDataV,_10>).super_TPZVec<MaterialDataV>.fNElements;
  pMVar1[lVar2 + -1].fMatID = object->fMatID;
  std::__cxx11::string::_M_assign((string *)&pMVar1[lVar2 + -1].fMaterial);
  TPZManVector<double,_10>::operator=
            (&pMVar1[lVar2 + -1].fProperties.super_TPZManVector<double,_10>,
             &(object->fProperties).super_TPZManVector<double,_10>);
  return;
}

Assistant:

void TPZStack<T, NumExtAlloc>::Push(const T object) {
	this->Resize(this->NElements()+1);
	this->operator[](this->NElements()-1) = object;
}